

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.cpp
# Opt level: O2

void __thiscall Vault::KeyValue::KeyValue(KeyValue *this,Client *client,Version version)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  allocator<char> local_31;
  char *local_30;
  size_type local_28;
  char local_20;
  undefined7 uStack_1f;
  undefined8 uStack_18;
  
  this->client_ = client;
  this->version_ = version;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"secret",&local_31);
  paVar1 = &(this->mount_).value_.field_2;
  (this->mount_).value_._M_dataplus._M_p = (pointer)paVar1;
  if (local_30 == &local_20) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_1f,local_20);
    *(undefined8 *)((long)&(this->mount_).value_.field_2 + 8) = uStack_18;
  }
  else {
    (this->mount_).value_._M_dataplus._M_p = local_30;
    (this->mount_).value_.field_2._M_allocated_capacity = CONCAT71(uStack_1f,local_20);
  }
  (this->mount_).value_._M_string_length = local_28;
  local_28 = 0;
  local_20 = '\0';
  local_30 = &local_20;
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

Vault::KeyValue::KeyValue(const Vault::Client &client,
                          KeyValue::Version version)
    : client_(client)
    , version_(version)
    , mount_("secret") {}